

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchCnf.c
# Opt level: O1

void Dch_ObjAddToFrontier(Dch_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vFrontier)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  int iVar4;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchCnf.c"
                  ,0x108,"void Dch_ObjAddToFrontier(Dch_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  if (p->pSatVars[pObj->Id] != 0) {
    return;
  }
  if ((*(uint *)&pObj->field_0x18 & 7) == 1) {
    return;
  }
  pVVar2 = p->vUsedNodes;
  uVar1 = pVVar2->nCap;
  if (pVVar2->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(0x80);
      }
      else {
        ppvVar3 = (void **)realloc(pVVar2->pArray,0x80);
      }
      pVVar2->pArray = ppvVar3;
      iVar4 = 0x10;
    }
    else {
      iVar4 = uVar1 * 2;
      if (iVar4 <= (int)uVar1) goto LAB_0092c172;
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar3 = (void **)realloc(pVVar2->pArray,(ulong)uVar1 << 4);
      }
      pVVar2->pArray = ppvVar3;
    }
    pVVar2->nCap = iVar4;
  }
LAB_0092c172:
  iVar4 = pVVar2->nSize;
  pVVar2->nSize = iVar4 + 1;
  pVVar2->pArray[iVar4] = pObj;
  iVar4 = p->nSatVars;
  p->nSatVars = iVar4 + 1;
  p->pSatVars[pObj->Id] = iVar4;
  if ((*(uint *)&pObj->field_0x18 & 7) - 7 < 0xfffffffe) {
    return;
  }
  uVar1 = vFrontier->nCap;
  if (vFrontier->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vFrontier->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(0x80);
      }
      else {
        ppvVar3 = (void **)realloc(vFrontier->pArray,0x80);
      }
      vFrontier->pArray = ppvVar3;
      iVar4 = 0x10;
    }
    else {
      iVar4 = uVar1 * 2;
      if (iVar4 <= (int)uVar1) goto LAB_0092c217;
      if (vFrontier->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar3 = (void **)realloc(vFrontier->pArray,(ulong)uVar1 << 4);
      }
      vFrontier->pArray = ppvVar3;
    }
    vFrontier->nCap = iVar4;
  }
LAB_0092c217:
  iVar4 = vFrontier->nSize;
  vFrontier->nSize = iVar4 + 1;
  vFrontier->pArray[iVar4] = pObj;
  return;
}

Assistant:

void Dch_ObjAddToFrontier( Dch_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vFrontier )
{
    assert( !Aig_IsComplement(pObj) );
    if ( Dch_ObjSatNum(p,pObj) )
        return;
    assert( Dch_ObjSatNum(p,pObj) == 0 );
    if ( Aig_ObjIsConst1(pObj) )
        return;
    Vec_PtrPush( p->vUsedNodes, pObj );
    Dch_ObjSetSatNum( p, pObj, p->nSatVars++ );
    if ( Aig_ObjIsNode(pObj) )
        Vec_PtrPush( vFrontier, pObj );
}